

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjCompressFromYUVPlanes
              (tjhandle handle,uchar **srcPlanes,int width,int *strides,int height,int subsamp,
              uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual,int flags)

{
  int iVar1;
  int iVar2;
  uint alloc;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  unsigned_long uVar7;
  JSAMPROW *ppJVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  JSAMPROW pJVar13;
  ulong uVar14;
  tjinstance *this;
  char *__string;
  JSAMPROW pJVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  size_t __n;
  long *in_FS_OFFSET;
  bool bVar19;
  int iw [10];
  int th [10];
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  uVar5 = 0xffffffff;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    tmpbuf[lVar6] = (JSAMPROW *)0x0;
    inbuf[lVar6] = (JSAMPROW *)0x0;
  }
  alloc = 1;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjCompressFromYUVPlanes(): Instance has not been initialized for compression",0x4d);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjCompressFromYUVPlanes(): Instance has not been initialized for compression",0x4d);
    pJVar13 = (JSAMPROW)0x0;
    goto LAB_0010d5b3;
  }
  if ((((((srcPlanes == (uchar **)0x0) || (100 < (uint)jpegQual)) ||
        (jpegSize == (unsigned_long *)0x0)) || ((jpegBuf == (uchar **)0x0 || (5 < (uint)subsamp))))
      || ((height < 1 || ((width < 1 || (*srcPlanes == (uchar *)0x0)))))) ||
     ((subsamp != 3 && ((srcPlanes[1] == (uchar *)0x0 || (srcPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
    in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
    in_FS_OFFSET[-0x17] = 0x6c61766e49203a29;
    in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
    in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
    pJVar13 = (JSAMPROW)0x0;
    goto LAB_0010d5b3;
  }
  iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
  if (iVar2 == 0) {
    *(int *)((long)handle + 0x30) = width;
    *(int *)((long)handle + 0x34) = height;
    if ((flags & 8U) == 0) {
      if ((flags & 0x10U) != 0) {
        __string = "JSIMD_FORCESSE=1";
        goto LAB_0010d668;
      }
      if ((flags & 0x20U) != 0) {
        __string = "JSIMD_FORCESSE2=1";
        goto LAB_0010d668;
      }
    }
    else {
      __string = "JSIMD_FORCEMMX=1";
LAB_0010d668:
      putenv(__string);
    }
    bVar19 = ((uint)flags >> 10 & 1) != 0;
    if (bVar19) {
      uVar7 = tjBufSize(width,height,subsamp);
      *jpegSize = uVar7;
    }
    alloc = (uint)!bVar19;
    jpeg_mem_dest_tj((j_compress_ptr)handle,jpegBuf,jpegSize,alloc);
    uVar17 = 0;
    setCompDefaults((jpeg_compress_struct *)handle,0,subsamp,jpegQual,flags);
    *(undefined4 *)((long)handle + 0x100) = 1;
    jpeg_start_compress((j_compress_ptr)handle,1);
    uVar5 = *(uint *)((long)handle + 0x4c);
    if ((int)*(uint *)((long)handle + 0x4c) < 1) {
      uVar5 = uVar17;
    }
    uVar10 = uVar17;
    for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
      lVar6 = *(long *)((long)handle + 0x58);
      lVar12 = uVar11 * 0x60;
      uVar16 = *(int *)(lVar6 + 0x1c + lVar12) * 8;
      iw[uVar11] = uVar16;
      uVar3 = *(uint *)((long)handle + 0x138);
      iVar2 = *(int *)(lVar6 + 0x20 + lVar12);
      uVar3 = ((-uVar3 & (*(int *)((long)handle + 0x30) + uVar3) - 1) * *(int *)(lVar6 + 8 + lVar12)
              ) / uVar3;
      pw[uVar11] = uVar3;
      uVar4 = *(uint *)((long)handle + 0x13c);
      iVar18 = *(int *)(lVar6 + 0xc + lVar12);
      uVar4 = ((-uVar4 & (*(int *)((long)handle + 0x34) + uVar4) - 1) * iVar18) / uVar4;
      ph[uVar11] = uVar4;
      if (iVar2 << 3 != uVar4 || uVar16 != uVar3) {
        uVar10 = 1;
      }
      iVar18 = iVar18 * 8;
      th[uVar11] = iVar18;
      ppJVar8 = (JSAMPROW *)malloc((long)(int)uVar4 * 8);
      inbuf[uVar11] = ppJVar8;
      if (ppJVar8 == (JSAMPROW *)0x0) goto LAB_0010d8aa;
      uVar17 = iVar18 * uVar16 + uVar17;
      pJVar13 = srcPlanes[uVar11];
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        ppJVar8[lVar6] = pJVar13;
        if ((strides == (int *)0x0) || (uVar16 = strides[uVar11], strides[uVar11] == 0)) {
          uVar16 = uVar3;
        }
        pJVar13 = pJVar13 + (int)uVar16;
      }
    }
    if (uVar10 == 0) {
      pJVar13 = (JSAMPROW)0x0;
    }
    else {
      pJVar13 = (JSAMPROW)malloc((long)(int)uVar17);
      if (pJVar13 == (JSAMPROW)0x0) {
LAB_0010d8aa:
        builtin_strncpy((char *)((long)handle + 0x628),"y al",4);
        builtin_strncpy((char *)((long)handle + 0x62c),"loca",4);
        builtin_strncpy((char *)((long)handle + 0x630),"tion",4);
        builtin_strncpy((char *)((long)handle + 0x634)," fai",4);
        builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
        builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
        builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
        *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
        *(undefined4 *)(in_FS_OFFSET + -0x16) = 0x6c612079;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"loca",4);
        *(undefined4 *)(in_FS_OFFSET + -0x15) = 0x6e6f6974;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa4)," fai",4);
        in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
        in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
        in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
        in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
        pJVar13 = (JSAMPROW)0x0;
        goto LAB_0010d919;
      }
      pJVar15 = pJVar13;
      for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
        uVar17 = th[uVar11];
        ppJVar8 = (JSAMPROW *)malloc((long)(int)uVar17 * 8);
        tmpbuf[uVar11] = ppJVar8;
        if (ppJVar8 == (JSAMPROW *)0x0) {
          builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
          builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
          builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
          builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
          builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
          *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
          in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
          in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
          in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
          in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
          in_FS_OFFSET[-0x1a] = 0x6572706d6f436a74;
          in_FS_OFFSET[-0x19] = 0x55596d6f72467373;
          goto LAB_0010d919;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          ppJVar8[uVar14] = pJVar15;
          pJVar15 = pJVar15 + iw[uVar11];
        }
      }
    }
    uVar5 = 0xffffffff;
    iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar2 == 0) {
      for (iVar2 = 0; iVar2 < *(int *)((long)handle + 0x34);
          iVar2 = iVar2 + *(int *)((long)handle + 0x13c) * 8) {
        for (lVar6 = 0; lVar6 < *(int *)((long)handle + 0x4c); lVar6 = lVar6 + 1) {
          uVar5 = (*(int *)(*(long *)((long)handle + 0x58) + 0xc + lVar6 * 0x60) * iVar2) /
                  *(int *)((long)handle + 0x13c);
          if (uVar10 == 0) {
            ppJVar8 = inbuf[lVar6] + (int)uVar5;
          }
          else {
            uVar17 = th[lVar6];
            iVar18 = ph[lVar6];
            uVar4 = iVar18 - uVar5;
            uVar3 = uVar4;
            if ((int)uVar17 < (int)uVar4) {
              uVar3 = uVar17;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            for (uVar11 = 0; uVar11 != uVar3; uVar11 = uVar11 + 1) {
              ppJVar8 = tmpbuf[lVar6];
              __n = (size_t)pw[lVar6];
              memcpy(ppJVar8[uVar11],inbuf[lVar6][uVar11 + (long)(int)uVar5],__n);
              iVar1 = iw[lVar6];
              for (sVar9 = __n; (long)sVar9 < (long)iVar1; sVar9 = sVar9 + 1) {
                pJVar15 = ppJVar8[uVar11];
                pJVar15[sVar9] = pJVar15[__n - 1];
              }
            }
            ppJVar8 = tmpbuf[lVar6];
            for (lVar12 = (long)(int)uVar4; lVar12 < (int)uVar17; lVar12 = lVar12 + 1) {
              memcpy(ppJVar8[lVar12],ppJVar8[(int)(iVar18 + ~uVar5)],(long)iw[lVar6]);
            }
          }
          yuvptr[lVar6] = ppJVar8;
        }
        jpeg_write_raw_data((j_compress_ptr)handle,yuvptr,*(int *)((long)handle + 0x13c) << 3);
      }
      jpeg_finish_compress((j_compress_ptr)handle);
      uVar5 = 0;
    }
  }
  else {
    pJVar13 = (JSAMPROW)0x0;
    alloc = 1;
LAB_0010d919:
    uVar5 = 0xffffffff;
  }
LAB_0010d5b3:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (alloc != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    free(tmpbuf[lVar6]);
    free(inbuf[lVar6]);
  }
  free(pJVar13);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar5;
}

Assistant:

DLLEXPORT int tjCompressFromYUVPlanes(tjhandle handle,
                                      const unsigned char **srcPlanes,
                                      int width, const int *strides,
                                      int height, int subsamp,
                                      unsigned char **jpegBuf,
                                      unsigned long *jpegSize, int jpegQual,
                                      int flags)
{
  int i, row, retval = 0, alloc = 1;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *inbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjCompressFromYUVPlanes(): Instance has not been initialized for compression");

  if (!srcPlanes || !srcPlanes[0] || width <= 0 || height <= 0 ||
      subsamp < 0 || subsamp >= NUMSUBOPT || jpegBuf == NULL ||
      jpegSize == NULL || jpegQual < 0 || jpegQual > 100)
    THROW("tjCompressFromYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjCompressFromYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, subsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, TJPF_RGB, subsamp, jpegQual, flags);
  cinfo->raw_data_in = TRUE;

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < cinfo->num_components; i++) {
    jpeg_component_info *compptr = &cinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * DCTSIZE;
    ih = compptr->height_in_blocks * DCTSIZE;
    pw[i] = PAD(cinfo->image_width, cinfo->max_h_samp_factor) *
            compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = PAD(cinfo->image_height, cinfo->max_v_samp_factor) *
            compptr->v_samp_factor / cinfo->max_v_samp_factor;
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * DCTSIZE;
    tmpbufsize += iw[i] * th[i];
    if ((inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < cinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < (int)cinfo->image_height;
       row += cinfo->max_v_samp_factor * DCTSIZE) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < cinfo->num_components; i++) {
      jpeg_component_info *compptr = &cinfo->comp_info[i];

      crow[i] = row * compptr->v_samp_factor / cinfo->max_v_samp_factor;
      if (usetmpbuf) {
        int j, k;

        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(tmpbuf[i][j], inbuf[i][crow[i] + j], pw[i]);
          /* Duplicate last sample in row to fill out MCU */
          for (k = pw[i]; k < iw[i]; k++)
            tmpbuf[i][j][k] = tmpbuf[i][j][pw[i] - 1];
        }
        /* Duplicate last row to fill out MCU */
        for (j = ph[i] - crow[i]; j < th[i]; j++)
          memcpy(tmpbuf[i][j], tmpbuf[i][ph[i] - crow[i] - 1], iw[i]);
        yuvptr[i] = tmpbuf[i];
      } else
        yuvptr[i] = &inbuf[i][crow[i]];
    }
    jpeg_write_raw_data(cinfo, yuvptr, cinfo->max_v_samp_factor * DCTSIZE);
  }
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(inbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}